

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O1

Type * slang::ast::PackedUnionType::fromSyntax
                 (Compilation *comp,StructUnionTypeSyntax *syntax,ASTContext *parentContext)

{
  bool *pbVar1;
  bitwidth_t *pbVar2;
  TokenKind TVar3;
  size_t sVar4;
  SyntaxNode *syntax_00;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar5;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_01;
  StructUnionMemberSyntax *pSVar6;
  Compilation *this;
  bool bVar7;
  bitwidth_t bVar8;
  bitwidth_t bVar9;
  PackedUnionType *type;
  Type *pTVar10;
  SourceLocation SVar11;
  Diagnostic *pDVar12;
  ulong uVar13;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar14;
  FieldSymbol *this_00;
  Type *this_01;
  reference pvVar15;
  byte bVar16;
  uint uVar17;
  pointer ppSVar18;
  long lVar19;
  uint uVar20;
  SourceRange SVar21;
  string_view sVar22;
  bool isTagged;
  bool isSoft;
  bool isSigned;
  Token name;
  ASTContext context;
  bool local_f3;
  bool local_f2;
  bool local_f1;
  ulong local_f0;
  StructUnionMemberSyntax *local_e8;
  Compilation *local_e0;
  uint local_d4;
  uint local_d0 [2];
  Token local_c8;
  PackedUnionType *local_b8;
  Scope *local_b0;
  string_view local_a8;
  StructUnionTypeSyntax *local_98;
  pointer local_90;
  pointer local_88;
  long local_80;
  ulong local_78;
  SourceLocation local_70;
  ASTContext local_68;
  
  local_f1 = (syntax->signing).kind == SignedKeyword;
  TVar3 = (syntax->taggedOrSoft).kind;
  local_f3 = TVar3 == TaggedKeyword;
  local_f2 = TVar3 == SoftKeyword;
  local_68.scope.ptr = (Scope *)parsing::Token::location(&syntax->keyword);
  local_e0 = comp;
  type = BumpAllocator::
         emplace<slang::ast::PackedUnionType,slang::ast::Compilation&,bool_const&,bool_const&,bool_const&,slang::SourceLocation,slang::ast::ASTContext_const&>
                   (&comp->super_BumpAllocator,comp,&local_f1,&local_f3,&local_f2,
                    (SourceLocation *)&local_68,parentContext);
  (type->super_IntegralType).super_Type.super_Symbol.originatingSyntax = (SyntaxNode *)syntax;
  local_b0 = &type->super_Scope;
  local_68.flags.m_bits = (parentContext->flags).m_bits;
  local_68.lookupIndex = 0xffffffff;
  local_68.instanceOrProc = (Symbol *)0x0;
  local_68.firstTempVar = (TempVarSymbol *)0x0;
  local_68.randomizeDetails = (RandomizeDetails *)0x0;
  local_68.assertionInstance = (AssertionInstanceDetails *)0x0;
  sVar4 = (syntax->members).
          super_span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  local_98 = syntax;
  local_68.scope.ptr = local_b0;
  if (sVar4 == 0) {
    uVar20 = 0;
    local_f0 = 0;
  }
  else {
    ppSVar18 = (syntax->members).
               super_span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>._M_ptr;
    local_90 = ppSVar18 + sVar4;
    local_f0 = 0;
    uVar20 = 0;
    local_b8 = type;
    do {
      local_e8 = *ppSVar18;
      syntax_00 = (local_e8->super_SyntaxNode).previewNode;
      local_88 = ppSVar18;
      if (syntax_00 != (SyntaxNode *)0x0) {
        Scope::addMembers(local_b0,syntax_00);
      }
      pTVar10 = Compilation::getType(local_e0,(local_e8->type).ptr,&local_68,(Type *)0x0);
      bVar7 = Type::isFourState(pTVar10);
      pbVar1 = &(type->super_IntegralType).isFourState;
      *pbVar1 = (bool)(*pbVar1 | bVar7);
      if (pTVar10->canonical == (Type *)0x0) {
        Type::resolveCanonical(pTVar10);
      }
      bVar16 = (byte)(local_f0 & 0xffffffffffffff01) |
               (pTVar10->canonical->super_Symbol).kind == ErrorType;
      local_f0 = CONCAT71((int7)((local_f0 & 0xffffffffffffff01) >> 8),bVar16);
      if ((bVar16 == 0) && (bVar7 = Type::isIntegral(pTVar10), !bVar7)) {
        if (local_f3 == true) {
          if (pTVar10->canonical == (Type *)0x0) {
            Type::resolveCanonical(pTVar10);
          }
          if ((pTVar10->canonical->super_Symbol).kind == VoidType) goto LAB_00426294;
        }
        pSVar6 = local_e8;
        local_c8 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)(local_e8->type).ptr);
        SVar11 = parsing::Token::location(&local_c8);
        pDVar12 = ASTContext::addDiag(&local_68,(DiagCode)0x1c0009,SVar11);
        ast::operator<<(pDVar12,pTVar10);
        SVar21 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)(pSVar6->type).ptr);
        type = local_b8;
        pDVar12 = Diagnostic::operator<<(pDVar12,SVar21);
        local_f0 = CONCAT71((int7)((ulong)pDVar12 >> 8),1);
      }
LAB_00426294:
      uVar13 = (local_e8->declarators).elements._M_extent._M_extent_value + 1;
      if (1 < uVar13) {
        uVar13 = uVar13 >> 1;
        lVar19 = 0;
        do {
          pSVar6 = local_e8;
          local_80 = lVar19;
          local_78 = uVar13;
          ppSVar14 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                               ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *
                                )((long)&(((local_e8->declarators).elements._M_ptr)->
                                         super_ConstTokenOrSyntax).
                                         super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                         .
                                         super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                         .
                                         super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                         .
                                         super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                 + lVar19));
          pSVar5 = *ppSVar14;
          local_c8 = *(Token *)(pSVar5 + 1);
          local_a8 = parsing::Token::valueText(&local_c8);
          local_70 = parsing::Token::location(&local_c8);
          this = local_e0;
          local_d0[1] = 0;
          local_d4 = uVar20;
          local_d0[0] = uVar20;
          this_00 = BumpAllocator::
                    emplace<slang::ast::FieldSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,unsigned_int,unsigned_int>
                              (&local_e0->super_BumpAllocator,&local_a8,&local_70,local_d0 + 1,
                               local_d0);
          (this_00->super_VariableSymbol).super_ValueSymbol.declaredType.type = pTVar10;
          (this_00->super_VariableSymbol).super_ValueSymbol.super_Symbol.originatingSyntax = pSVar5;
          syntax_01._M_ptr =
               (pSVar6->attributes).
               super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
          syntax_01._M_extent._M_extent_value =
               (pSVar6->attributes).
               super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
               _M_extent._M_extent_value;
          Symbol::setAttributes((Symbol *)this_00,local_68.scope.ptr,syntax_01);
          Scope::insertMember(local_b0,(Symbol *)this_00,(type->super_Scope).lastMember,false,true);
          this_01 = Compilation::getType
                              (this,pTVar10,
                               (SyntaxList<slang::syntax::VariableDimensionSyntax> *)
                               &pSVar5[1].previewNode,&local_68);
          bVar7 = Type::isUnpackedArray(this_01);
          if ((bVar7) && ((local_f0 & 1) == 0)) {
            SVar21 = parsing::Token::range((Token *)(pSVar5 + 1));
            pDVar12 = ASTContext::addDiag(&local_68,(DiagCode)0x1c0009,SVar21);
            ast::operator<<(pDVar12,this_01);
            SVar21 = slang::syntax::SyntaxNode::sourceRange(pSVar5 + 2);
            pDVar12 = Diagnostic::operator<<(pDVar12,SVar21);
            local_f0 = CONCAT71((int7)((ulong)pDVar12 >> 8),1);
          }
          type = local_b8;
          uVar20 = local_d4;
          bVar8 = (local_b8->super_IntegralType).bitWidth;
          if (bVar8 == 0) {
            bVar8 = Type::getBitWidth(pTVar10);
LAB_00426450:
            (type->super_IntegralType).bitWidth = bVar8;
          }
          else {
            if ((local_f3 != false) || (local_f2 == true)) {
              bVar8 = Type::getBitWidth(pTVar10);
              uVar17 = (type->super_IntegralType).bitWidth;
              if (bVar8 < uVar17) {
                bVar8 = uVar17;
              }
              goto LAB_00426450;
            }
            bVar9 = Type::getBitWidth(pTVar10);
            if (((bVar8 != bVar9) && ((local_f0 & 1) == 0)) &&
               (sVar22 = parsing::Token::valueText(&local_c8), sVar22._M_len != 0)) {
              SVar21 = parsing::Token::range(&local_c8);
              pDVar12 = ASTContext::addDiag(&local_68,(DiagCode)0x1e0009,SVar21);
              sVar22 = parsing::Token::valueText(&local_c8);
              pDVar12 = Diagnostic::operator<<(pDVar12,sVar22);
              bVar8 = Type::getBitWidth(pTVar10);
              local_a8._M_len = (ulong)bVar8;
              std::
              vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
              ::emplace_back<unsigned_long>(&pDVar12->args,&local_a8._M_len);
              local_a8._M_len = (ulong)(type->super_IntegralType).bitWidth;
              pvVar15 = std::
                        vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                        ::emplace_back<unsigned_long>(&pDVar12->args,&local_a8._M_len);
              local_f0 = CONCAT71((int7)((ulong)pvVar15 >> 8),1);
            }
          }
          if (*(long *)(pSVar5 + 4) != 0) {
            SVar11 = parsing::Token::location((Token *)(*(long *)(pSVar5 + 4) + 0x18));
            pDVar12 = ASTContext::addDiag(&local_68,(DiagCode)0x1b0009,SVar11);
            SVar21 = slang::syntax::SyntaxNode::sourceRange
                               (*(SyntaxNode **)(*(long *)(pSVar5 + 4) + 0x28));
            Diagnostic::operator<<(pDVar12,SVar21);
          }
          lVar19 = local_80 + 0x30;
          uVar20 = uVar20 + 1;
          uVar13 = local_78 - 1;
        } while (uVar13 != 0);
      }
      ppSVar18 = local_88 + 1;
    } while (ppSVar18 != local_90);
  }
  if ((local_f3 & uVar20 != 0) != 0) {
    uVar17 = 0x20;
    uVar20 = uVar20 - 1;
    if (uVar20 != 0) {
      uVar17 = 0x1f;
      if (uVar20 != 0) {
        for (; uVar20 >> uVar17 == 0; uVar17 = uVar17 - 1) {
        }
      }
      uVar17 = uVar17 ^ 0x1f;
    }
    type->tagBits = 0x20 - uVar17;
    pbVar2 = &(type->super_IntegralType).bitWidth;
    *pbVar2 = *pbVar2 + (0x20 - uVar17);
  }
  if ((type->super_IntegralType).bitWidth == 0 || (local_f0 & 1) != 0) {
    pTVar10 = local_e0->errorType;
  }
  else {
    pTVar10 = anon_unknown.dwarf_17aeba0::createPackedDims
                        (&local_68,(Type *)type,&local_98->dimensions);
  }
  return pTVar10;
}

Assistant:

const Type& PackedUnionType::fromSyntax(Compilation& comp, const StructUnionTypeSyntax& syntax,
                                        const ASTContext& parentContext) {
    const bool isSigned = syntax.signing.kind == TokenKind::SignedKeyword;
    const bool isTagged = syntax.taggedOrSoft.kind == TokenKind::TaggedKeyword;
    const bool isSoft = syntax.taggedOrSoft.kind == TokenKind::SoftKeyword;
    bool issuedError = false;
    uint32_t fieldIndex = 0;

    auto unionType = comp.emplace<PackedUnionType>(comp, isSigned, isTagged, isSoft,
                                                   syntax.keyword.location(), parentContext);
    unionType->setSyntax(syntax);

    ASTContext context(*unionType, LookupLocation::max, parentContext.flags);

    for (auto member : syntax.members) {
        if (member->previewNode)
            unionType->addMembers(*member->previewNode);

        const Type& type = comp.getType(*member->type, context);
        unionType->isFourState |= type.isFourState();
        issuedError |= type.isError();

        if (!issuedError && !type.isIntegral() && (!isTagged || !type.isVoid())) {
            issuedError = true;
            auto& diag = context.addDiag(diag::PackedMemberNotIntegral,
                                         member->type->getFirstToken().location());
            diag << type;
            diag << member->type->sourceRange();
        }

        for (auto decl : member->declarators) {
            auto name = decl->name;
            auto field = comp.emplace<FieldSymbol>(name.valueText(), name.location(), 0u,
                                                   fieldIndex++);
            field->setType(type);
            field->setSyntax(*decl);
            field->setAttributes(*context.scope, member->attributes);
            unionType->addMember(*field);

            // Unpacked arrays are disallowed in packed unions.
            if (const Type& dimType = comp.getType(type, decl->dimensions, context);
                dimType.isUnpackedArray() && !issuedError) {

                auto& diag = context.addDiag(diag::PackedMemberNotIntegral, decl->name.range());
                diag << dimType;
                diag << decl->dimensions.sourceRange();
                issuedError = true;
            }

            if (!unionType->bitWidth) {
                unionType->bitWidth = type.getBitWidth();
            }
            else if (isTagged || isSoft) {
                // In tagged unions the members don't all have to have the same width.
                unionType->bitWidth = std::max(unionType->bitWidth, type.getBitWidth());
            }
            else if (unionType->bitWidth != type.getBitWidth() && !issuedError &&
                     !name.valueText().empty()) {
                auto& diag = context.addDiag(diag::PackedUnionWidthMismatch, name.range());
                diag << name.valueText() << type.getBitWidth() << unionType->bitWidth;
                issuedError = true;
            }

            if (decl->initializer) {
                auto& diag = context.addDiag(diag::PackedMemberHasInitializer,
                                             decl->initializer->equals.location());
                diag << decl->initializer->expr->sourceRange();
            }
        }
    }

    // In tagged unions the tag contributes to the total number of packed bits.
    if (isTagged && fieldIndex) {
        unionType->tagBits = (uint32_t)std::bit_width(fieldIndex - 1);
        unionType->bitWidth += unionType->tagBits;
    }

    if (!unionType->bitWidth || issuedError)
        return comp.getErrorType();

    return createPackedDims(context, unionType, syntax.dimensions);
}